

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_setup.cpp
# Opt level: O0

void P_FloodZones(void)

{
  zone_t *pzVar1;
  ReverbContainer *local_18;
  ReverbContainer *reverb;
  int i;
  int z;
  
  reverb._4_4_ = 0;
  for (reverb._0_4_ = 0; (int)reverb < numsectors; reverb._0_4_ = (int)reverb + 1) {
    if (sectors[(int)reverb].ZoneNumber == 0xffff) {
      P_FloodZone(sectors + (int)reverb,reverb._4_4_);
      reverb._4_4_ = reverb._4_4_ + 1;
    }
  }
  TArray<zone_t,_zone_t>::Resize(&Zones,reverb._4_4_);
  local_18 = S_FindEnvironment(level.DefaultEnvironment);
  if (local_18 == (ReverbContainer *)0x0) {
    Printf("Sound environment %d, %d not found\n",(ulong)(uint)(level.DefaultEnvironment >> 8),
           (ulong)(level.DefaultEnvironment & 0xff));
    local_18 = DefaultEnvironments[0];
  }
  for (reverb._0_4_ = 0; (int)reverb < (int)reverb._4_4_; reverb._0_4_ = (int)reverb + 1) {
    pzVar1 = TArray<zone_t,_zone_t>::operator[](&Zones,(long)(int)reverb);
    pzVar1->Environment = local_18;
  }
  return;
}

Assistant:

void P_FloodZones ()
{
	int z = 0, i;
	ReverbContainer *reverb;

	for (i = 0; i < numsectors; ++i)
	{
		if (sectors[i].ZoneNumber == 0xFFFF)
		{
			P_FloodZone (&sectors[i], z++);
		}
	}
	Zones.Resize(z);
	reverb = S_FindEnvironment(level.DefaultEnvironment);
	if (reverb == NULL)
	{
		Printf("Sound environment %d, %d not found\n", level.DefaultEnvironment >> 8, level.DefaultEnvironment & 255);
		reverb = DefaultEnvironments[0];
	}
	for (i = 0; i < z; ++i)
	{
		Zones[i].Environment = reverb;
	}
}